

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Date.cpp
# Opt level: O0

void __thiscall asl::Date::Date(Date *this,String *str,String *fmt)

{
  char cVar1;
  char *pcVar2;
  int local_48;
  int iStack_44;
  char c;
  int second;
  int minute;
  int hour;
  int day;
  int month;
  int year;
  char *s;
  char *f;
  String *fmt_local;
  String *str_local;
  Date *this_local;
  
  f = (char *)fmt;
  fmt_local = str;
  str_local = (String *)this;
  s = asl::String::operator_cast_to_char_(fmt);
  _month = asl::String::operator_cast_to_char_(fmt_local);
  day = 0;
  hour = 0;
  minute = 0;
  second = 0;
  iStack_44 = 0;
  local_48 = 0;
  do {
    pcVar2 = s + 1;
    cVar1 = *s;
    s = pcVar2;
    if (cVar1 == '\0') {
      construct(this,LOCAL,day,hour,minute,second,iStack_44,local_48);
      return;
    }
    switch(cVar1) {
    case 'D':
      minute = parseSkipNumber((char **)&month);
      break;
    default:
      if ((cVar1 != '?') && (*_month != cVar1)) {
        this->_t = 0.0;
        return;
      }
      _month = _month + 1;
      break;
    case 'M':
      hour = parseSkipNumber((char **)&month);
      break;
    case 'Y':
      day = parseSkipNumber((char **)&month);
      break;
    case 'h':
      second = parseSkipNumber((char **)&month);
      break;
    case 'm':
      iStack_44 = parseSkipNumber((char **)&month);
      break;
    case 's':
      local_48 = parseSkipNumber((char **)&month);
    }
  } while( true );
}

Assistant:

Date::Date(const String& str, const String& fmt)
{
	const char* f = fmt;
	const char* s = str;
	int         year = 0, month = 0, day = 0, hour = 0, minute = 0, second = 0;

	while (char c = *f++)
	{
		switch (c)
		{
		case 'Y':
			year = parseSkipNumber(s);
			break;
		case 'D':
			day = parseSkipNumber(s);
			break;
		case 'M':
			month = parseSkipNumber(s);
			break;
		case 'h':
			hour = parseSkipNumber(s);
			break;
		case 'm':
			minute = parseSkipNumber(s);
			break;
		case 's':
			second = parseSkipNumber(s);
			break;
		default:
			if (c != '?' && *s != c)
			{
				_t = 0;
				return;
			}
			s++;
		}
	}
	construct(LOCAL, year, month, day, hour, minute, second);
}